

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O0

void __thiscall GlobOptBlockData::SetChangedSym(GlobOptBlockData *this,Sym *sym)

{
  bool bVar1;
  StackSym *this_00;
  Sym *sym_local;
  GlobOptBlockData *this_local;
  
  if ((sym != (Sym *)0x0) && (bVar1 = Sym::IsStackSym(sym), bVar1)) {
    this_00 = Sym::AsStackSym(sym);
    bVar1 = StackSym::HasByteCodeRegSlot(this_00);
    if (bVar1) {
      SetChangedSym(this,sym->m_id);
    }
  }
  return;
}

Assistant:

void
GlobOptBlockData::SetChangedSym(Sym* sym)
{
    if (sym && sym->IsStackSym() && sym->AsStackSym()->HasByteCodeRegSlot())
    {
        SetChangedSym(sym->m_id);
    }
}